

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::~UninterpretedOption(UninterpretedOption *this)

{
  UninterpretedOption *in_RDI;
  
  ~UninterpretedOption(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

UninterpretedOption::~UninterpretedOption() {
  // @@protoc_insertion_point(destructor:google.protobuf.UninterpretedOption)
  SharedDtor();
}